

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v9::basic_printf_context<fmt::v9::appender,_char>,_short,_int,_char[3],_int,_char[3],_short,_short,_char[4608]>
* __thiscall
fmt::v9::
make_format_args<fmt::v9::basic_printf_context<fmt::v9::appender,char>,short_const&,int_const&,char_const(&)[3],int_const&,char_const(&)[3],short_const&,short_const&,char_const(&)[4608]>
          (format_arg_store<fmt::v9::basic_printf_context<fmt::v9::appender,_char>,_short,_int,_char[3],_int,_char[3],_short,_short,_char[4608]>
           *__return_storage_ptr__,v9 *this,short *args,int *args_1,char (*args_2) [3],int *args_3,
          char (*args_4) [3],short *args_5,short *args_6,char (*args_7) [4608])

{
  bool formattable;
  bool formattable_pointer;
  bool formattable_const;
  bool formattable_char;
  int *arg;
  bool formattable_5;
  bool formattable_pointer_5;
  bool formattable_const_5;
  bool formattable_char_5;
  int *arg_5;
  bool formattable_6;
  bool formattable_pointer_6;
  bool formattable_const_6;
  bool formattable_char_6;
  int *arg_6;
  bool formattable_7;
  bool formattable_pointer_7;
  bool formattable_const_7;
  bool formattable_char_7;
  char_type **arg_7;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_const_1;
  bool formattable_char_1;
  int *arg_1;
  bool formattable_3;
  bool formattable_pointer_3;
  bool formattable_const_3;
  bool formattable_char_3;
  int *arg_3;
  bool formattable_2;
  bool formattable_pointer_2;
  bool formattable_const_2;
  bool formattable_char_2;
  char_type **arg_2;
  bool formattable_4;
  bool formattable_pointer_4;
  bool formattable_const_4;
  bool formattable_char_4;
  char_type **arg_4;
  longlong local_3a8;
  size_t local_3a0;
  longlong local_368;
  size_t local_360;
  longlong local_328;
  size_t local_320;
  size_t local_250;
  longlong local_208;
  size_t local_200;
  longlong local_1b8;
  size_t local_1b0;
  size_t local_80;
  char (*args_local_4) [3];
  int *args_local_3;
  char (*args_local_2) [3];
  int *args_local_1;
  short *args_local;
  size_t local_30;
  
  local_3a8._0_4_ = (int)*(short *)this;
  local_208._0_4_ = *(undefined4 *)args;
  local_1b8._0_4_ = *(undefined4 *)args_2;
  local_368._0_4_ = (int)*(short *)*args_4;
  local_328._0_4_ = (int)*args_5;
  (__return_storage_ptr__->data_).args_[0].field_0.long_long_value = local_3a8;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_3a0;
  (__return_storage_ptr__->data_).args_[1].field_0.long_long_value = local_208;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_200;
  (__return_storage_ptr__->data_).args_[2].field_0.string.data = (char *)args_1;
  (__return_storage_ptr__->data_).args_[2].field_0.string.size = local_80;
  (__return_storage_ptr__->data_).args_[3].field_0.long_long_value = local_1b8;
  (__return_storage_ptr__->data_).args_[3].field_0.string.size = local_1b0;
  (__return_storage_ptr__->data_).args_[4].field_0.string.data = (char *)args_3;
  (__return_storage_ptr__->data_).args_[4].field_0.string.size = local_30;
  (__return_storage_ptr__->data_).args_[5].field_0.long_long_value = local_368;
  (__return_storage_ptr__->data_).args_[5].field_0.string.size = local_360;
  (__return_storage_ptr__->data_).args_[6].field_0.long_long_value = local_328;
  (__return_storage_ptr__->data_).args_[6].field_0.string.size = local_320;
  (__return_storage_ptr__->data_).args_[7].field_0.string.data = (char *)args_6;
  (__return_storage_ptr__->data_).args_[7].field_0.string.size = local_250;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(Args&&... args)
    -> format_arg_store<Context, remove_cvref_t<Args>...> {
  return {FMT_FORWARD(args)...};
}